

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall libtorrent::upnp::next(upnp *this,rootdevice *d,port_mapping_t i)

{
  pointer pmVar1;
  pointer pmVar2;
  long lVar3;
  port_mapping_t i_00;
  pointer pmVar4;
  long lVar5;
  
  if (i.m_val < (int)(((long)(this->m_mappings).
                             super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                             .
                             super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_mappings).
                            super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                            .
                            super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x48) + -1) {
    i_00.m_val = i.m_val + 1;
    goto LAB_00333266;
  }
  pmVar1 = (d->mapping).
           super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>.
           super__Vector_base<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar2 = (d->mapping).
           super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>.
           super__Vector_base<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pmVar2 - (long)pmVar1;
  pmVar4 = pmVar1;
  for (lVar3 = lVar5 / 0x58 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    if ((pmVar4->super_base_mapping).act != none) goto LAB_00333253;
    if (pmVar4[1].super_base_mapping.act != none) {
      pmVar4 = pmVar4 + 1;
      goto LAB_00333253;
    }
    if (pmVar4[2].super_base_mapping.act != none) {
      pmVar4 = pmVar4 + 2;
      goto LAB_00333253;
    }
    if (pmVar4[3].super_base_mapping.act != none) {
      pmVar4 = pmVar4 + 3;
      goto LAB_00333253;
    }
    pmVar4 = pmVar4 + 4;
    lVar5 = lVar5 + -0x160;
  }
  lVar5 = lVar5 / 0x58;
  if (lVar5 == 1) {
LAB_00333233:
    if ((pmVar4->super_base_mapping).act == none) {
      pmVar4 = pmVar2;
    }
  }
  else if (lVar5 == 2) {
LAB_00333229:
    if ((pmVar4->super_base_mapping).act == none) {
      pmVar4 = pmVar4 + 1;
      goto LAB_00333233;
    }
  }
  else {
    if (lVar5 != 3) {
      return;
    }
    if ((pmVar4->super_base_mapping).act == none) {
      pmVar4 = pmVar4 + 1;
      goto LAB_00333229;
    }
  }
LAB_00333253:
  if (pmVar4 == pmVar2) {
    return;
  }
  i_00.m_val = (int)(((long)pmVar4 - (long)pmVar1) / 0x58);
LAB_00333266:
  update_map(this,d,i_00);
  return;
}

Assistant:

void upnp::next(rootdevice& d, port_mapping_t const i)
{
	TORRENT_ASSERT(is_single_thread());
	TORRENT_ASSERT(!d.disabled);
	if (i < prev(m_mappings.end_index()))
	{
		update_map(d, lt::next(i));
	}
	else
	{
		auto const j = std::find_if(d.mapping.begin(), d.mapping.end()
			, [](mapping_t const& m) { return m.act != portmap_action::none; });
		if (j == d.mapping.end()) return;

		update_map(d, port_mapping_t{static_cast<int>(j - d.mapping.begin())});
	}
}